

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_2.h
# Opt level: O1

void __thiscall
dlib::sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>::
move_to_pos(sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>
            *this,node **current_node,unsigned_long *current_pos,unsigned_long pos,
           unsigned_long size)

{
  ulong uVar1;
  long lVar2;
  node *pnVar3;
  ulong uVar4;
  
  uVar1 = *current_pos;
  lVar2 = uVar1 - pos;
  if (uVar1 < pos || lVar2 == 0) {
    if (lVar2 != 0) {
      uVar4 = (size - pos) + uVar1;
      *current_pos = pos;
      if (uVar4 < pos - uVar1) {
        if (uVar4 != 0) {
          pnVar3 = *current_node;
          do {
            pnVar3 = pnVar3->left;
            *current_node = pnVar3;
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
      }
      else if (pos != uVar1) {
        pnVar3 = *current_node;
        do {
          pnVar3 = pnVar3->right;
          *current_node = pnVar3;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0);
      }
    }
  }
  else {
    uVar4 = (size + pos) - uVar1;
    *current_pos = pos;
    if (uVar1 - pos < uVar4) {
      if (uVar1 != pos) {
        pnVar3 = *current_node;
        lVar2 = pos - uVar1;
        do {
          pnVar3 = pnVar3->left;
          *current_node = pnVar3;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0);
      }
    }
    else if (uVar4 != 0) {
      pnVar3 = *current_node;
      do {
        pnVar3 = pnVar3->right;
        *current_node = pnVar3;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  return;
}

Assistant:

void sequence_kernel_2<T,mem_manager>::
    move_to_pos (
        node*& current_node,
        unsigned long& current_pos,
        unsigned long pos,
        unsigned long size
    ) const
    {
        if ( current_pos > pos)
        {
            // number of hops in each direction needed to reach pos
            unsigned long right = size + pos - current_pos;
            unsigned long left = current_pos - pos;
            current_pos = pos;

            if (left < right)
            {
                // move left to position pos
                for (; left > 0; --left)
                    current_node = current_node->left;
            }
            else
            {
                // move left to position pos
                for (; right > 0; --right)
                    current_node = current_node->right;
            }
        }
        else if (current_pos != pos)
        {
            // number of hops in each direction needed to reach pos
            unsigned long right = pos - current_pos;
            unsigned long left = size - pos + current_pos;
            current_pos = pos;

            if (left < right)
            {
                // move left to position pos
                for (; left > 0; --left)
                    current_node = current_node->left;
            }
            else
            {
                // move left to position pos
                for (; right > 0; --right)
                    current_node = current_node->right;
            }
        }
    }